

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::either::scan(either *this,location *loc)

{
  bool bVar1;
  region *this_00;
  long in_RSI;
  region *in_RDI;
  scanner_storage *other;
  const_iterator __end2;
  const_iterator __begin2;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *__range2;
  region *reg;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
  *in_stack_ffffffffffffffa8;
  region *this_01;
  __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
  local_28;
  
  this_00 = (region *)(in_RSI + 8);
  this_01 = in_RDI;
  local_28._M_current =
       (scanner_storage *)
       CLI::std::
       vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::begin
                 (in_stack_ffffffffffffffa8);
  CLI::std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                      ((__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      region::region(this_00);
      return this_01;
    }
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator*(&local_28);
    scanner_storage::scan((scanner_storage *)this_01,(location *)in_RDI);
    bVar1 = region::is_ok((region *)0x24b455);
    if (bVar1) break;
    region::~region(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator++(&local_28);
  }
  return this_01;
}

Assistant:

TOML11_INLINE region either::scan(location& loc) const
{
    for(const auto& other : others_)
    {
        const auto reg = other.scan(loc);
        if(reg.is_ok())
        {
            return reg;
        }
    }
    return region{};
}